

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void concatwsFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int nSep_00;
  uchar *zSep_00;
  char *zSep;
  int nSep;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  nSep_00 = sqlite3_value_bytes(*argv);
  zSep_00 = sqlite3_value_text(*argv);
  if (zSep_00 != (uchar *)0x0) {
    concatFuncCore(context,argc + -1,argv + 1,nSep_00,(char *)zSep_00);
  }
  return;
}

Assistant:

static void concatwsFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int nSep = sqlite3_value_bytes(argv[0]);
  const char *zSep = (const char*)sqlite3_value_text(argv[0]);
  if( zSep==0 ) return;
  concatFuncCore(context, argc-1, argv+1, nSep, zSep);
}